

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O2

void aom_highbd_blend_a64_mask_c
               (uint8_t *dst_8,uint32_t dst_stride,uint8_t *src0_8,uint32_t src0_stride,
               uint8_t *src1_8,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               int subw,int subh,int bd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  
  lVar1 = (long)dst_8 * 2;
  lVar2 = (long)src0_8 * 2;
  lVar3 = (long)src1_8 * 2;
  if (subh == 0 && subw == 0) {
    uVar7 = 0;
    if (w < 1) {
      w = uVar7;
    }
    if (h < 1) {
      h = uVar7;
    }
    uVar11 = 0;
    uVar13 = 0;
    uVar12 = 0;
    for (uVar15 = 0; uVar17 = (ulong)(uint)w, uVar8 = uVar7, uVar10 = uVar11, uVar16 = uVar12,
        uVar14 = uVar13, uVar15 != h; uVar15 = uVar15 + 1) {
      while( true ) {
        if (uVar17 == 0) break;
        *(short *)(lVar1 + (ulong)uVar16 * 2) =
             (short)((uint)*(ushort *)(lVar3 + (ulong)uVar14 * 2) * (0x40 - (uint)mask[uVar8]) +
                     (uint)*(ushort *)(lVar2 + (ulong)uVar10 * 2) * (uint)mask[uVar8] + 0x20 >> 6);
        uVar17 = uVar17 - 1;
        uVar8 = uVar8 + 1;
        uVar10 = uVar10 + 1;
        uVar16 = uVar16 + 1;
        uVar14 = uVar14 + 1;
      }
      uVar12 = uVar12 + dst_stride;
      uVar13 = uVar13 + src1_stride;
      uVar11 = uVar11 + src0_stride;
      uVar7 = uVar7 + mask_stride;
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    uVar7 = 0;
    if (w < 1) {
      w = uVar7;
    }
    if (h < 1) {
      h = uVar7;
    }
    iVar5 = mask_stride * 2;
    uVar13 = 0;
    uVar15 = 0;
    iVar6 = 0;
    for (uVar11 = 0; uVar11 != h; uVar11 = uVar11 + 1) {
      uVar12 = uVar13;
      uVar14 = uVar15;
      uVar8 = uVar7;
      for (uVar17 = 0; (uint)(w * 2) != uVar17; uVar17 = uVar17 + 2) {
        iVar4 = (int)uVar17;
        uVar10 = (uint)mask[mask_stride + iVar4 + 1] +
                 (uint)mask[iVar6 + iVar4 + 1] +
                 (uint)mask[mask_stride + iVar4] + (uint)mask[(uint)(iVar6 + iVar4)] + 2 >> 2;
        *(short *)(lVar1 + (ulong)uVar14 * 2) =
             (short)((uint)*(ushort *)(lVar3 + (ulong)uVar12 * 2) * (0x40 - uVar10) +
                     *(ushort *)(lVar2 + (ulong)uVar8 * 2) * uVar10 + 0x20 >> 6);
        uVar14 = uVar14 + 1;
        uVar12 = uVar12 + 1;
        uVar8 = uVar8 + 1;
      }
      iVar6 = iVar6 + iVar5;
      mask_stride = mask_stride + iVar5;
      uVar15 = uVar15 + dst_stride;
      uVar13 = uVar13 + src1_stride;
      uVar7 = uVar7 + src0_stride;
    }
  }
  else {
    uVar7 = 0;
    if (w < 1) {
      w = uVar7;
    }
    if (h < 1) {
      h = uVar7;
    }
    if ((subw ^ 1U) == 0 && subh == 0) {
      uVar11 = 0;
      uVar13 = 0;
      uVar12 = 0;
      uVar7 = 0;
      for (uVar15 = 0; uVar17 = (ulong)(uint)w, uVar14 = uVar11, uVar8 = uVar13, uVar10 = uVar7,
          uVar16 = uVar12, uVar15 != h; uVar15 = uVar15 + 1) {
        while (uVar17 != 0) {
          uVar9 = (uint)mask[uVar10] + (uint)mask[uVar10 + 1] + 1 >> 1 & 0xff;
          *(short *)(lVar1 + (ulong)uVar16 * 2) =
               (short)((uint)*(ushort *)(lVar3 + (ulong)uVar8 * 2) * (0x40 - uVar9) +
                       *(ushort *)(lVar2 + (ulong)uVar14 * 2) * uVar9 + 0x20 >> 6);
          uVar17 = uVar17 - 1;
          uVar14 = uVar14 + 1;
          uVar8 = uVar8 + 1;
          uVar10 = uVar10 + 2;
          uVar16 = uVar16 + 1;
        }
        uVar7 = uVar7 + mask_stride;
        uVar12 = uVar12 + dst_stride;
        uVar13 = uVar13 + src1_stride;
        uVar11 = uVar11 + src0_stride;
      }
    }
    else {
      uVar13 = 0;
      uVar12 = 0;
      uVar11 = 0;
      for (uVar15 = 0; uVar17 = (ulong)(uint)w, uVar16 = uVar12, uVar14 = uVar7, uVar8 = uVar13,
          uVar10 = uVar11, uVar15 != h; uVar15 = uVar15 + 1) {
        while( true ) {
          if (uVar17 == 0) break;
          uVar9 = (uint)mask[uVar14] + (uint)mask[mask_stride + uVar14] + 1 >> 1 & 0xff;
          *(short *)(lVar1 + (ulong)uVar10 * 2) =
               (short)(*(ushort *)(lVar2 + (ulong)uVar8 * 2) * uVar9 +
                       (uint)*(ushort *)(lVar3 + (ulong)uVar16 * 2) * (0x40 - uVar9) + 0x20 >> 6);
          uVar17 = uVar17 - 1;
          uVar16 = uVar16 + 1;
          uVar14 = uVar14 + 1;
          uVar8 = uVar8 + 1;
          uVar10 = uVar10 + 1;
        }
        uVar11 = uVar11 + dst_stride;
        uVar12 = uVar12 + src1_stride;
        uVar13 = uVar13 + src0_stride;
        uVar7 = uVar7 + mask_stride * 2;
      }
    }
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_mask_c(uint8_t *dst_8, uint32_t dst_stride,
                                 const uint8_t *src0_8, uint32_t src0_stride,
                                 const uint8_t *src1_8, uint32_t src1_stride,
                                 const uint8_t *mask, uint32_t mask_stride,
                                 int w, int h, int subw, int subh, int bd) {
  int i, j;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst_8);
  const uint16_t *src0 = CONVERT_TO_SHORTPTR(src0_8);
  const uint16_t *src1 = CONVERT_TO_SHORTPTR(src1_8);
  (void)bd;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  assert(bd == 8 || bd == 10 || bd == 12);

  if (subw == 0 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = mask[i * mask_stride + j];
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else if (subw == 1 && subh == 1) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = ROUND_POWER_OF_TWO(
            mask[(2 * i) * mask_stride + (2 * j)] +
                mask[(2 * i + 1) * mask_stride + (2 * j)] +
                mask[(2 * i) * mask_stride + (2 * j + 1)] +
                mask[(2 * i + 1) * mask_stride + (2 * j + 1)],
            2);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else if (subw == 1 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = AOM_BLEND_AVG(mask[i * mask_stride + (2 * j)],
                                    mask[i * mask_stride + (2 * j + 1)]);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = AOM_BLEND_AVG(mask[(2 * i) * mask_stride + j],
                                    mask[(2 * i + 1) * mask_stride + j]);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  }
}